

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

DebuggerScope * __thiscall
Js::FunctionBody::RecordStartScopeObject
          (FunctionBody *this,DiagExtraScopesType scopeType,int start,RegSlot scopeLocation,
          int *index)

{
  bool bVar1;
  uint32 index_00;
  ScopeObjectChain *pSVar2;
  Recycler *pRVar3;
  DebuggerScope *pDStack_70;
  int currentDebuggerScopeIndex;
  DebuggerScope *debuggerScope;
  undefined8 local_60;
  TrackAllocData local_58;
  Recycler *local_30;
  Recycler *recycler;
  int *index_local;
  int local_18;
  RegSlot scopeLocation_local;
  int start_local;
  DiagExtraScopesType scopeType_local;
  FunctionBody *this_local;
  
  recycler = (Recycler *)index;
  index_local._4_4_ = scopeLocation;
  local_18 = start;
  scopeLocation_local = scopeType;
  _start_local = this;
  local_30 = ScriptContext::GetRecycler
                       ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
  pSVar2 = GetScopeObjectChain(this);
  pRVar3 = local_30;
  if (pSVar2 == (ScopeObjectChain *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_58,(type_info *)&ScopeObjectChain::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x1ed0);
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_58);
    debuggerScope = (DebuggerScope *)Memory::Recycler::AllocInlined;
    local_60 = 0;
    pSVar2 = (ScopeObjectChain *)new<Memory::Recycler>(8,pRVar3,0x43c4b0);
    ScopeObjectChain::ScopeObjectChain(pSVar2,local_30);
    SetScopeObjectChain(this,pSVar2);
  }
  pDStack_70 = (DebuggerScope *)0x0;
  index_00 = GetNextDebuggerScopeIndex(this);
  bVar1 = TryGetDebuggerScopeAt(this,index_00,&stack0xffffffffffffff90);
  if (bVar1) {
    DebuggerScope::UpdateDueToByteCodeRegeneration
              (pDStack_70,scopeLocation_local,local_18,index_local._4_4_);
  }
  else {
    pDStack_70 = AddScopeObject(this,scopeLocation_local,local_18,index_local._4_4_);
  }
  if (recycler != (Recycler *)0x0) {
    recycler->Cookie = index_00;
  }
  return pDStack_70;
}

Assistant:

DebuggerScope* FunctionBody::RecordStartScopeObject(DiagExtraScopesType scopeType, int start, RegSlot scopeLocation, int* index)
    {
        Recycler* recycler = m_scriptContext->GetRecycler();

        if (!GetScopeObjectChain())
        {
            SetScopeObjectChain(RecyclerNew(recycler, ScopeObjectChain, recycler));
        }

        // Check if we need to create the scope object or if it already exists from a previous bytecode
        // generator pass.
        DebuggerScope* debuggerScope = nullptr;
        int currentDebuggerScopeIndex = this->GetNextDebuggerScopeIndex();
        if (!this->TryGetDebuggerScopeAt(currentDebuggerScopeIndex, debuggerScope))
        {
            // Create a new debugger scope.
            debuggerScope = AddScopeObject(scopeType, start, scopeLocation);
        }
        else
        {
            debuggerScope->UpdateDueToByteCodeRegeneration(scopeType, start, scopeLocation);
        }

        if(index)
        {
            *index = currentDebuggerScopeIndex;
        }

        return debuggerScope;
    }